

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_means_template.h
# Opt level: O1

void av1_calc_indices_dim1_c
               (int16_t *data,int16_t *centroids,uint8_t *indices,int64_t *dist,int n,int k)

{
  uint uVar1;
  ushort uVar2;
  ushort uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  
  if (dist != (int64_t *)0x0) {
    *dist = 0;
  }
  if (0 < n) {
    uVar6 = 0;
    do {
      uVar2 = (ushort)((int)data[uVar6] - (int)*centroids);
      uVar3 = -uVar2;
      if (0 < (int)data[uVar6] - (int)*centroids) {
        uVar3 = uVar2;
      }
      uVar7 = (uint)uVar3;
      indices[uVar6] = '\0';
      if (1 < k) {
        uVar4 = 1;
        do {
          uVar5 = (int)data[uVar6] - (int)centroids[uVar4];
          uVar1 = -uVar5;
          if (0 < (int)uVar5) {
            uVar1 = uVar5;
          }
          if ((uVar1 & 0xffff) < uVar7) {
            indices[uVar6] = (uint8_t)uVar4;
            uVar7 = uVar1 & 0xffff;
          }
          uVar4 = uVar4 + 1;
        } while ((uint)k != uVar4);
      }
      if (dist != (int64_t *)0x0) {
        *dist = *dist + (ulong)(uVar7 * uVar7);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)n);
  }
  return;
}

Assistant:

void RENAME_C(av1_calc_indices)(const int16_t *data, const int16_t *centroids,
                                uint8_t *indices, int64_t *dist, int n, int k) {
  if (dist) {
    *dist = 0;
  }
  for (int i = 0; i < n; ++i) {
    int min_dist = RENAME(calc_dist)(data + i * AV1_K_MEANS_DIM, centroids);
    indices[i] = 0;
    for (int j = 1; j < k; ++j) {
      const int this_dist = RENAME(calc_dist)(data + i * AV1_K_MEANS_DIM,
                                              centroids + j * AV1_K_MEANS_DIM);
      if (this_dist < min_dist) {
        min_dist = this_dist;
        indices[i] = j;
      }
    }
    if (dist) {
#if AV1_K_MEANS_DIM == 1
      *dist += min_dist * min_dist;
#else
      *dist += min_dist;
#endif
    }
  }
}